

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::Texture2DShader
          (Texture2DShader *this,DataTypes *samplerTypes,DataType outputType,Vec4 *outScale,
          Vec4 *outBias)

{
  long *plVar1;
  Vec4 *pVVar2;
  DataType DVar3;
  Texture2DShader *pTVar4;
  int i;
  GenericVecType GVar5;
  pointer __dest;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  pointer pIVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_type __dnew;
  ostringstream s;
  Uniform local_368;
  long *local_340;
  long local_338;
  long local_330;
  undefined4 uStack_328;
  undefined4 uStack_324;
  DataTypes *local_320;
  ulong *local_318;
  long local_310;
  ulong local_308 [2];
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  undefined2 local_2e0;
  undefined1 local_2de;
  DataType local_2d4;
  Texture2DShader *local_2d0;
  undefined1 local_2c8 [32];
  GenericVecType local_2a8;
  ios_base local_258 [264];
  Vec4 *local_150;
  Vec4 *local_148;
  ShaderProgramDeclaration local_140;
  
  local_320 = samplerTypes;
  local_150 = outScale;
  local_148 = outBias;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  local_368.name.field_2._M_allocated_capacity._0_4_ = 0x6f705f61;
  local_368.name.field_2._M_allocated_capacity._4_4_ = 0x69746973;
  local_368.name.field_2._8_2_ = 0x6e6f;
  local_368.name._M_string_length = 10;
  local_368.name.field_2._M_local_buf[10] = '\0';
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_2c8);
  local_2a8 = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  local_368.name.field_2._M_allocated_capacity._0_4_ = 0x6f635f61;
  local_368.name._M_string_length = 7;
  local_368.name.field_2._M_allocated_capacity._4_4_ = 0x64726f;
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>();
  local_2a8 = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffff0000000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexToFragmentVarying *)local_2c8);
  if (outputType == TYPE_FLOAT_VEC4) {
    GVar5 = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    GVar5 = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    GVar5 = GENERICVECTYPE_INT32;
  }
  else {
    GVar5 = GENERICVECTYPE_LAST;
  }
  local_2c8._0_4_ = GVar5;
  local_2d4 = outputType;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentOutput *)local_2c8);
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  local_340 = (long *)0x9c;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_340);
  plVar1 = local_340;
  local_368.name.field_2._M_allocated_capacity._0_4_ = SUB84(local_340,0);
  local_368.name.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_340 >> 0x20);
  local_368.name._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main(void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
         ,0x9c);
  local_368.name._M_string_length = (size_type)plVar1;
  __dest[(long)plVar1] = '\0';
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c8,local_368.name._M_dataplus._M_p,
             (long)plVar1 + local_368.name._M_dataplus._M_p);
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexSource *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"layout(location = 0) out highp ",0x1f);
  pcVar6 = glu::getDataTypeName(local_2d4);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)&local_368 + (int)*(undefined8 *)(local_2c8._0_8_ + -0x18) + 0xa0);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8," o_color0;\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"in highp vec2 v_coord;\n",0x17);
  local_2d0 = this;
  if (0 < (int)((ulong)((long)(local_320->vec).
                              super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_320->vec).
                             super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    lVar12 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"uniform ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8," ",1);
      pcVar6 = glu::getDataTypeName
                         ((local_320->vec).
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12]);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)&local_368 + (int)*(undefined8 *)(local_2c8._0_8_ + -0x18) + 0xa0);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8," u_sampler",10);
      iVar11 = (int)lVar12;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_2c8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"uniform ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8," vec4 u_texScale",0x10);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_2c8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"uniform ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8," vec4 u_texBias",0xf)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_2c8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)((ulong)((long)(local_320->vec).
                                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_320->vec).
                                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8," vec4 u_outScale0;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8," vec4 u_outBias0;\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"highp",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8," vec4 out0 = vec4(0.0);\n",0x18);
  if (0 < (int)((ulong)((long)(local_320->vec).
                              super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_320->vec).
                             super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\tout0 += vec4(",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"texture(u_sampler",0x11);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_2c8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", v_coord)) * u_texScale",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," + u_texBias",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 < (int)((ulong)((long)(local_320->vec).
                                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_320->vec).
                                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\to_color0 = ",0xc);
  pcVar6 = glu::getDataTypeName(local_2d4);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)&local_368 + (int)*(undefined8 *)(local_2c8._0_8_ + -0x18) + 0xa0);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"(out0 * u_outScale0 + u_outBias0);\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base(local_258);
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_340,(undefined1 *)(local_338 + (long)local_340));
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentSource *)&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  local_368.name.field_2._M_allocated_capacity._0_4_ = 0x756f5f75;
  local_368.name.field_2._M_allocated_capacity._4_4_ = 0x61635374;
  local_368.name.field_2._8_2_ = 0x656c;
  local_368.name.field_2._M_local_buf[10] = '0';
  local_368.name._M_string_length = 0xb;
  local_368.name.field_2._M_local_buf[0xb] = '\0';
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>();
  local_2a8 = 4;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
  local_368.name.field_2._M_allocated_capacity._0_4_ = 0x756f5f75;
  local_368.name.field_2._M_allocated_capacity._4_4_ = 0x61694274;
  local_368.name.field_2._8_2_ = 0x3073;
  local_368.name._M_string_length = 10;
  local_368.name.field_2._M_local_buf[10] = '\0';
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>();
  local_2a8 = 4;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
    operator_delete(local_368.name._M_dataplus._M_p,
                    CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                             local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((local_320->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_320->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      local_2e8 = 0x656c706d61735f75;
      local_2f0 = 9;
      local_2e0 = 0x72;
      local_2f8 = &local_2e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_2c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      uVar14 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar14 = local_2e8;
      }
      if (uVar14 < (ulong)(local_310 + local_2f0)) {
        uVar14 = 0xf;
        if (local_318 != local_308) {
          uVar14 = local_308[0];
        }
        if (uVar14 < (ulong)(local_310 + local_2f0)) goto LAB_0150565b;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_0150565b:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_318);
      }
      plVar1 = puVar9 + 2;
      if ((long *)*puVar9 == plVar1) {
        local_330 = *plVar1;
        uStack_328 = *(undefined4 *)(puVar9 + 3);
        uStack_324 = *(undefined4 *)((long)puVar9 + 0x1c);
        local_340 = &local_330;
      }
      else {
        local_330 = *plVar1;
        local_340 = (long *)*puVar9;
      }
      local_338 = puVar9[1];
      *puVar9 = plVar1;
      puVar9[1] = 0;
      *(undefined1 *)plVar1 = 0;
      DVar3 = (local_320->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13];
      local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_340,(undefined1 *)(local_338 + (long)local_340));
      local_368.type = DVar3;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
        operator_delete(local_368.name._M_dataplus._M_p,
                        CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                                 local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,local_330 + 1);
      }
      if (local_318 != local_308) {
        operator_delete(local_318,local_308[0] + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      local_2e8 = 0x6163537865745f75;
      local_2e0 = 0x656c;
      local_2f0 = 10;
      local_2de = 0;
      local_2f8 = &local_2e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_2c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      uVar14 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar14 = local_2e8;
      }
      if (uVar14 < (ulong)(local_310 + local_2f0)) {
        uVar14 = 0xf;
        if (local_318 != local_308) {
          uVar14 = local_308[0];
        }
        if (uVar14 < (ulong)(local_310 + local_2f0)) goto LAB_01505810;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_01505810:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_318);
      }
      plVar1 = puVar9 + 2;
      if ((long *)*puVar9 == plVar1) {
        local_330 = *plVar1;
        uStack_328 = *(undefined4 *)(puVar9 + 3);
        uStack_324 = *(undefined4 *)((long)puVar9 + 0x1c);
        local_340 = &local_330;
      }
      else {
        local_330 = *plVar1;
        local_340 = (long *)*puVar9;
      }
      local_338 = puVar9[1];
      *puVar9 = plVar1;
      puVar9[1] = 0;
      *(undefined1 *)plVar1 = 0;
      local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_340,(undefined1 *)(local_338 + (long)local_340));
      local_368.type = TYPE_FLOAT_VEC4;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
        operator_delete(local_368.name._M_dataplus._M_p,
                        CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                                 local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,local_330 + 1);
      }
      if (local_318 != local_308) {
        operator_delete(local_318,local_308[0] + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      local_2e8 = 0x6169427865745f75;
      local_2f0 = 9;
      local_2e0 = 0x73;
      local_2f8 = &local_2e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_2c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      uVar14 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar14 = local_2e8;
      }
      if (uVar14 < (ulong)(local_310 + local_2f0)) {
        uVar14 = 0xf;
        if (local_318 != local_308) {
          uVar14 = local_308[0];
        }
        if (uVar14 < (ulong)(local_310 + local_2f0)) goto LAB_015059b5;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_015059b5:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_318);
      }
      plVar1 = puVar9 + 2;
      if ((long *)*puVar9 == plVar1) {
        local_330 = *plVar1;
        uStack_328 = *(undefined4 *)(puVar9 + 3);
        uStack_324 = *(undefined4 *)((long)puVar9 + 0x1c);
        local_340 = &local_330;
      }
      else {
        local_330 = *plVar1;
        local_340 = (long *)*puVar9;
      }
      local_338 = puVar9[1];
      *puVar9 = plVar1;
      puVar9[1] = 0;
      *(undefined1 *)plVar1 = 0;
      local_368.name._M_dataplus._M_p = (pointer)&local_368.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_340,(undefined1 *)(local_338 + (long)local_340));
      local_368.type = TYPE_FLOAT_VEC4;
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.name._M_dataplus._M_p != &local_368.name.field_2) {
        operator_delete(local_368.name._M_dataplus._M_p,
                        CONCAT44(local_368.name.field_2._M_allocated_capacity._4_4_,
                                 local_368.name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (local_340 != &local_330) {
        operator_delete(local_340,local_330 + 1);
      }
      if (local_318 != local_308) {
        operator_delete(local_318,local_308[0] + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(local_320->vec).
                                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_320->vec).
                                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pTVar4 = local_2d0;
  sglr::ShaderProgram::ShaderProgram(&local_2d0->super_ShaderProgram,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (pTVar4->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_021ac730;
  (pTVar4->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_021ac768;
  (pTVar4->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_021ac780;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar4->m_inputs).
  super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = 0;
  do {
    (pTVar4->m_outScale).m_data[lVar12] = local_150->m_data[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    (pTVar4->m_outBias).m_data[lVar12] = local_148->m_data[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  pTVar4->m_outputType = local_2d4;
  std::
  vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ::resize(&pTVar4->m_inputs,
           (long)(local_320->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_320->vec).super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  pIVar10 = (pTVar4->m_inputs).
            super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pTVar4->m_inputs).
                              super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar10) >> 2) *
          0x38e38e39) {
    lVar12 = 0;
    do {
      pIVar10 = pIVar10 + lVar12;
      pIVar10->unitNdx = (int)lVar12;
      lVar15 = 0;
      do {
        *(undefined4 *)(local_2c8 + lVar15 * 4) = 0x3f800000;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      *(undefined8 *)(pIVar10->scale).m_data = local_2c8._0_8_;
      *(undefined8 *)((pIVar10->scale).m_data + 2) = local_2c8._8_8_;
      pVVar2 = &(pTVar4->m_inputs).
                super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar12].bias;
      pVVar2->m_data[0] = 0.0;
      pVVar2->m_data[1] = 0.0;
      pVVar2->m_data[2] = 0.0;
      pVVar2->m_data[3] = 0.0;
      lVar12 = lVar12 + 1;
      pIVar10 = (pTVar4->m_inputs).
                super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(pTVar4->m_inputs).
                                          super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar10
                                   ) >> 2) * 0x38e38e39);
  }
  return;
}

Assistant:

Texture2DShader::Texture2DShader (const DataTypes& samplerTypes, glu::DataType outputType, const Vec4& outScale, const Vec4& outBias)
	: sglr::ShaderProgram	(genTexture2DShaderDecl(samplerTypes, outputType))
	, m_outScale			(outScale)
	, m_outBias				(outBias)
	, m_outputType			(outputType)
{
	m_inputs.resize(samplerTypes.vec.size());

	// Initialize units.
	for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
	{
		m_inputs[ndx].unitNdx	= ndx;
		m_inputs[ndx].scale		= Vec4(1.0f);
		m_inputs[ndx].bias		= Vec4(0.0f);
	}
}